

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

hash_elem * hash_remove(hash *hash,hash_elem *e)

{
  undefined4 uVar1;
  avl_node *paVar2;
  avl_tree *in_RSI;
  long in_RDI;
  avl_tree *unaff_retaddr;
  avl_node *node;
  hash_elem *hash_elem;
  int bucket;
  avl_cmp_func *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  avl_node *in_stack_fffffffffffffff8;
  
  uVar1 = (**(code **)(in_RDI + 0x10))(in_RDI,in_RSI);
  paVar2 = avl_search(in_RSI,(avl_node *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  if (paVar2 == (avl_node *)0x0) {
    paVar2 = (avl_node *)0x0;
  }
  else {
    avl_remove(unaff_retaddr,in_stack_fffffffffffffff8);
  }
  return (hash_elem *)paVar2;
}

Assistant:

struct hash_elem * hash_remove(struct hash *hash, struct hash_elem *e)
{
    int bucket = hash->hash_func(hash, e);
    struct hash_elem *hash_elem;

    IFDEF_LOCK( spin_lock(hash->locks + bucket) );

#ifdef _HASH_TREE
    struct avl_node *node;
    node = avl_search(hash->buckets + bucket, &e->avl, _hash_cmp_wrap);
    if (node) {
        avl_remove(hash->buckets + bucket, node);
        IFDEF_LOCK( spin_unlock(hash->locks + bucket) );
        hash_elem = _get_entry(node, struct hash_elem, avl);
        return hash_elem;
    }

#else
    struct list_elem *le;
    le = list_begin(hash->buckets + bucket);
    while(le) {
        hash_elem = _get_entry(le, struct hash_elem, list_elem);
        if (!hash->cmp(e, hash_elem)) {
            list_remove(hash->buckets + bucket, le);

            IFDEF_LOCK( spin_unlock(hash->locks + bucket) );

            return hash_elem;
        }
        le = list_next(le);
    }
#endif

    IFDEF_LOCK( spin_unlock(hash->locks + bucket) );

    return NULL;
}